

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spl_inl.h
# Opt level: O2

int16_t WebRtcSpl_NormU32(uint32_t a)

{
  short sVar1;
  short sVar2;
  
  if (a != 0) {
    sVar2 = (ushort)(a < 0x10000) * 0x10;
    sVar1 = sVar2 + 8;
    if (0xffffff < a << (sbyte)sVar2) {
      sVar1 = sVar2;
    }
    sVar2 = sVar1 + 4;
    if (0xfffffff < a << ((byte)sVar1 & 0x1f)) {
      sVar2 = sVar1;
    }
    sVar1 = sVar2 + 2;
    if (0x3fffffff < a << ((byte)sVar2 & 0x1f)) {
      sVar1 = sVar2;
    }
    return (ushort)(-1 < (int)(a << ((byte)sVar1 & 0x1f))) + sVar1;
  }
  return 0;
}

Assistant:

static __inline int16_t WebRtcSpl_NormU32(uint32_t a) {
  int16_t zeros;

  if (a == 0) return 0;

  if (!(0xFFFF0000 & a)) {
    zeros = 16;
  } else {
    zeros = 0;
  }
  if (!(0xFF000000 & (a << zeros))) zeros += 8;
  if (!(0xF0000000 & (a << zeros))) zeros += 4;
  if (!(0xC0000000 & (a << zeros))) zeros += 2;
  if (!(0x80000000 & (a << zeros))) zeros += 1;

  return zeros;
}